

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O1

void __thiscall dns::Message::removeAllRecords(Message *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  QuerySection *pQVar2;
  pointer pcVar3;
  pointer ppRVar4;
  ResourceRecord *pRVar5;
  pointer ppQVar6;
  pointer ppQVar7;
  pointer ppRVar8;
  
  ppQVar6 = (this->mQueries).
            super__Vector_base<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppQVar7 = (this->mQueries).
                 super__Vector_base<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppQVar7 != ppQVar6; ppQVar7 = ppQVar7 + 1
      ) {
    pQVar2 = *ppQVar7;
    if (pQVar2 != (QuerySection *)0x0) {
      pcVar3 = (pQVar2->mQName)._M_dataplus._M_p;
      paVar1 = &(pQVar2->mQName).field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != paVar1) {
        operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
      }
      operator_delete(pQVar2,0x28);
    }
    ppQVar6 = (this->mQueries).
              super__Vector_base<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  ppQVar7 = (this->mQueries).
            super__Vector_base<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppQVar6 != ppQVar7) {
    (this->mQueries).super__Vector_base<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppQVar7;
  }
  for (ppRVar8 = (this->mAnswers).
                 super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppRVar4 = (this->mAnswers).
                super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>.
                _M_impl.super__Vector_impl_data._M_finish, ppRVar8 != ppRVar4; ppRVar8 = ppRVar8 + 1
      ) {
    pRVar5 = *ppRVar8;
    if (pRVar5 != (ResourceRecord *)0x0) {
      ResourceRecord::~ResourceRecord(pRVar5);
      operator_delete(pRVar5,0x38);
    }
  }
  ppRVar8 = (this->mAnswers).
            super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppRVar4 != ppRVar8) {
    (this->mAnswers).
    super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppRVar8;
  }
  for (ppRVar8 = (this->mAuthorities).
                 super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppRVar4 = (this->mAuthorities).
                super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>.
                _M_impl.super__Vector_impl_data._M_finish, ppRVar8 != ppRVar4; ppRVar8 = ppRVar8 + 1
      ) {
    pRVar5 = *ppRVar8;
    if (pRVar5 != (ResourceRecord *)0x0) {
      ResourceRecord::~ResourceRecord(pRVar5);
      operator_delete(pRVar5,0x38);
    }
  }
  ppRVar8 = (this->mAuthorities).
            super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppRVar4 != ppRVar8) {
    (this->mAuthorities).
    super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppRVar8;
  }
  for (ppRVar8 = (this->mAdditional).
                 super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppRVar4 = (this->mAdditional).
                super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>.
                _M_impl.super__Vector_impl_data._M_finish, ppRVar8 != ppRVar4; ppRVar8 = ppRVar8 + 1
      ) {
    pRVar5 = *ppRVar8;
    if (pRVar5 != (ResourceRecord *)0x0) {
      ResourceRecord::~ResourceRecord(pRVar5);
      operator_delete(pRVar5,0x38);
    }
  }
  ppRVar8 = (this->mAdditional).
            super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppRVar4 != ppRVar8) {
    (this->mAdditional).
    super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppRVar8;
  }
  return;
}

Assistant:

void Message::removeAllRecords()
{
    // delete all queries
    for(std::vector<QuerySection*>::iterator it = mQueries.begin(); it != mQueries.end(); ++it)
        delete(*it);
    mQueries.clear();
     
    // delete answers 
    for(std::vector<ResourceRecord*>::iterator it = mAnswers.begin(); it != mAnswers.end(); ++it)
        delete(*it);
    mAnswers.clear();

    // delete authorities
    for(std::vector<ResourceRecord*>::iterator it = mAuthorities.begin(); it != mAuthorities.end(); ++it)
        delete(*it);
    mAuthorities.clear();

    // delete additional 
    for(std::vector<ResourceRecord*>::iterator it = mAdditional.begin(); it != mAdditional.end(); ++it)
        delete(*it);
    mAdditional.clear();
}